

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<int,unsigned_int,unsigned_int,long,long,long>
               (ostream *out,char *fmt,int *args,uint *args_1,uint *args_2,long *args_3,long *args_4
               ,long *args_5)

{
  ostream *in_RSI;
  long *in_RDI;
  int *in_R8;
  uint *in_R9;
  long in_FS_OFFSET;
  FormatListRef in_stack_00000010;
  uint local_a8 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<int,unsigned_int,unsigned_int,long,long,long>
            (in_R8,in_R9,local_a8,(long *)in_RSI,in_RDI,in_RDI);
  vformat(in_RSI,(char *)in_RDI,in_stack_00000010);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}